

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadRegionsBuilder.cpp
# Opt level: O3

void __thiscall ThreadRegionsBuilder::clear(ThreadRegionsBuilder *this)

{
  _Rb_tree_header *p_Var1;
  _Hash_node_base *p_Var2;
  void *pvVar3;
  _Rb_tree_node_base *p_Var4;
  unordered_map<Node_*,_ThreadRegion_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>_>
  *__range1;
  _Hash_node_base *p_Var5;
  
  for (p_Var5 = (this->visitedNodeToRegionMap)._M_h._M_before_begin._M_nxt;
      p_Var5 != (_Hash_node_base *)0x0; p_Var5 = p_Var5->_M_nxt) {
    p_Var2 = p_Var5[2]._M_nxt;
    if (p_Var2 != (_Hash_node_base *)0x0) {
      std::
      _Rb_tree<ThreadRegion_*,_ThreadRegion_*,_std::_Identity<ThreadRegion_*>,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
      ::_M_erase((_Rb_tree<ThreadRegion_*,_ThreadRegion_*,_std::_Identity<ThreadRegion_*>,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
                  *)(p_Var2 + 0xe),(_Link_type)p_Var2[0x10]._M_nxt);
      std::
      _Rb_tree<ThreadRegion_*,_ThreadRegion_*,_std::_Identity<ThreadRegion_*>,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
      ::_M_erase((_Rb_tree<ThreadRegion_*,_ThreadRegion_*,_std::_Identity<ThreadRegion_*>,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
                  *)(p_Var2 + 8),(_Link_type)p_Var2[10]._M_nxt);
      std::
      _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>::
      _M_erase((_Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
                *)(p_Var2 + 2),(_Link_type)p_Var2[4]._M_nxt);
    }
    operator_delete(p_Var2,0xa0);
  }
  for (p_Var5 = (this->examinedNodeToRegionMap)._M_h._M_before_begin._M_nxt;
      p_Var5 != (_Hash_node_base *)0x0; p_Var5 = p_Var5->_M_nxt) {
    p_Var2 = p_Var5[2]._M_nxt;
    if (p_Var2 != (_Hash_node_base *)0x0) {
      std::
      _Rb_tree<ThreadRegion_*,_ThreadRegion_*,_std::_Identity<ThreadRegion_*>,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
      ::_M_erase((_Rb_tree<ThreadRegion_*,_ThreadRegion_*,_std::_Identity<ThreadRegion_*>,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
                  *)(p_Var2 + 0xe),(_Link_type)p_Var2[0x10]._M_nxt);
      std::
      _Rb_tree<ThreadRegion_*,_ThreadRegion_*,_std::_Identity<ThreadRegion_*>,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
      ::_M_erase((_Rb_tree<ThreadRegion_*,_ThreadRegion_*,_std::_Identity<ThreadRegion_*>,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
                  *)(p_Var2 + 8),(_Link_type)p_Var2[10]._M_nxt);
      std::
      _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>::
      _M_erase((_Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
                *)(p_Var2 + 2),(_Link_type)p_Var2[4]._M_nxt);
    }
    operator_delete(p_Var2,0xa0);
  }
  std::
  _Hashtable<Node_*,_std::pair<Node_*const,_ThreadRegion_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>,_std::__detail::_Select1st,_std::equal_to<Node_*>,_std::hash<Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear((_Hashtable<Node_*,_std::pair<Node_*const,_ThreadRegion_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>,_std::__detail::_Select1st,_std::equal_to<Node_*>,_std::hash<Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)this);
  std::
  _Hashtable<Node_*,_std::pair<Node_*const,_ThreadRegion_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>,_std::__detail::_Select1st,_std::equal_to<Node_*>,_std::hash<Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->examinedNodeToRegionMap)._M_h);
  p_Var1 = &(this->threadRegions_)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var4 = (this->threadRegions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    pvVar3 = *(void **)(p_Var4 + 1);
    if (pvVar3 != (void *)0x0) {
      std::
      _Rb_tree<ThreadRegion_*,_ThreadRegion_*,_std::_Identity<ThreadRegion_*>,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
      ::_M_erase((_Rb_tree<ThreadRegion_*,_ThreadRegion_*,_std::_Identity<ThreadRegion_*>,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
                  *)((long)pvVar3 + 0x70),*(_Link_type *)((long)pvVar3 + 0x80));
      std::
      _Rb_tree<ThreadRegion_*,_ThreadRegion_*,_std::_Identity<ThreadRegion_*>,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
      ::_M_erase((_Rb_tree<ThreadRegion_*,_ThreadRegion_*,_std::_Identity<ThreadRegion_*>,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
                  *)((long)pvVar3 + 0x40),*(_Link_type *)((long)pvVar3 + 0x50));
      std::
      _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>::
      _M_erase((_Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
                *)((long)pvVar3 + 0x10),*(_Link_type *)((long)pvVar3 + 0x20));
    }
    operator_delete(pvVar3,0xa0);
  }
  std::
  _Rb_tree<ThreadRegion_*,_ThreadRegion_*,_std::_Identity<ThreadRegion_*>,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
  ::_M_erase(&(this->threadRegions_)._M_t,
             (_Link_type)
             (this->threadRegions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  (this->threadRegions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->threadRegions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->threadRegions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->threadRegions_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

void ThreadRegionsBuilder::clear() {
    for (auto iterator : visitedNodeToRegionMap) {
        delete iterator.second;
    }

    for (auto iterator : examinedNodeToRegionMap) {
        delete iterator.second;
    }

    clearComputingData();

    for (auto *iterator : threadRegions_) {
        delete iterator;
    }

    threadRegions_.clear();
}